

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propname.cpp
# Opt level: O0

int32_t icu_63::PropNameData::getPropertyValueEnum(int32_t property,char *alias)

{
  int32_t iVar1;
  int32_t valueMapIndex;
  char *alias_local;
  int32_t property_local;
  
  iVar1 = findProperty(property);
  if (iVar1 == 0) {
    alias_local._4_4_ = -1;
  }
  else if ((&valueMaps)[iVar1 + 1] == 0) {
    alias_local._4_4_ = -1;
  }
  else {
    alias_local._4_4_ = getPropertyOrValueEnum((&valueMaps)[(int)(&valueMaps)[iVar1 + 1]],alias);
  }
  return alias_local._4_4_;
}

Assistant:

int32_t PropNameData::getPropertyValueEnum(int32_t property, const char *alias) {
    int32_t valueMapIndex=findProperty(property);
    if(valueMapIndex==0) {
        return UCHAR_INVALID_CODE;  // Not a known property.
    }
    valueMapIndex=valueMaps[valueMapIndex+1];
    if(valueMapIndex==0) {
        return UCHAR_INVALID_CODE;  // The property does not have named values.
    }
    // valueMapIndex is the start of the property's valueMap,
    // where the first word is the BytesTrie offset.
    return getPropertyOrValueEnum(valueMaps[valueMapIndex], alias);
}